

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O2

void __thiscall JSONRPCRequest::parse(JSONRPCRequest *this,UniValue *valRequest)

{
  string_view source_file;
  string str;
  bool bVar1;
  bool bVar2;
  UniValue *pUVar3;
  UniValue *pUVar4;
  string *psVar5;
  Logger *pLVar6;
  JSONRPCVersion JVar7;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view key_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file_00;
  undefined1 in_stack_fffffffffffffea8 [16];
  undefined1 local_138 [16];
  string log_msg;
  string local_d0 [4];
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (valRequest->typ != VOBJ) {
    pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,"Invalid Request object",(allocator<char> *)&local_50);
    JSONRPCError(pUVar3,-0x7f58,&log_msg);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
    goto LAB_002f9a6e;
  }
  pUVar3 = UniValue::get_obj(valRequest);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log_msg,"id",(allocator<char> *)&local_50);
  bVar1 = UniValue::exists(pUVar3,&log_msg);
  std::__cxx11::string::~string((string *)&log_msg);
  if (bVar1) {
    key._M_str = "id";
    key._M_len = 2;
    pUVar4 = UniValue::find_value(pUVar3,key);
    std::optional<UniValue>::operator=((optional<UniValue> *)this,pUVar4);
  }
  else {
    ::wallet::_GLOBAL__N_1::std::_Optional_payload_base<UniValue>::_M_reset
              ((_Optional_payload_base<UniValue> *)this);
  }
  this->m_json_version = V1_LEGACY;
  key_00._M_str = "jsonrpc";
  key_00._M_len = 7;
  pUVar4 = UniValue::find_value(pUVar3,key_00);
  if (pUVar4->typ != VNULL) {
    if (pUVar4->typ != VSTR) {
      pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_msg,"jsonrpc field must be a string",(allocator<char> *)&local_50);
      JSONRPCError(pUVar3,-0x7f58,&log_msg);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_002f9a6e;
    }
    psVar5 = UniValue::get_str_abi_cxx11_(pUVar4);
    bVar1 = std::operator==(psVar5,"1.0");
    JVar7 = V1_LEGACY;
    if (!bVar1) {
      psVar5 = UniValue::get_str_abi_cxx11_(pUVar4);
      bVar1 = std::operator==(psVar5,"2.0");
      if (!bVar1) {
        pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&log_msg,"JSON-RPC version not supported",(allocator<char> *)&local_50)
        ;
        JSONRPCError(pUVar3,-0x7f58,&log_msg);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_002f9a6e;
      }
      JVar7 = V2;
    }
    this->m_json_version = JVar7;
  }
  key_01._M_str = "method";
  key_01._M_len = 6;
  pUVar4 = UniValue::find_value(pUVar3,key_01);
  if (pUVar4->typ != VSTR) {
    if (pUVar4->typ == VNULL) {
      pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_msg,"Missing method",(allocator<char> *)&local_50);
      JSONRPCError(pUVar3,-0x7f58,&log_msg);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else {
      pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_msg,"Method must be a string",(allocator<char> *)&local_50);
      JSONRPCError(pUVar3,-0x7f58,&log_msg);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    goto LAB_002f9a6e;
  }
  psVar5 = UniValue::get_str_abi_cxx11_(pUVar4);
  this_00 = &this->strMethod;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,psVar5);
  bVar1 = fLogIPs;
  bVar2 = LogAcceptCategory((LogFlags)this_00,(Level)psVar5);
  if (bVar1 == true) {
    if (bVar2) {
      str_00._M_str = (this->strMethod)._M_dataplus._M_p;
      str_00._M_len = (this->strMethod)._M_string_length;
      SanitizeString_abi_cxx11_(local_d0,str_00,0);
      pLVar6 = LogInstance();
      bVar1 = BCLog::Logger::Enabled(pLVar6);
      if (bVar1) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (&local_50,(tinyformat *)"ThreadRPCServer method=%s user=%s peeraddr=%s\n",
                   (char *)local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &this->authUser,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &this->peerAddr,in_R9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        pLVar6 = LogInstance();
        local_50._M_dataplus._M_p = (pointer)0x58;
        local_50._M_string_length = 0x426168;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/request.cpp"
        ;
        source_file._M_len = 0x58;
        str_01._M_str = log_msg._M_dataplus._M_p;
        str_01._M_len = log_msg._M_string_length;
        logging_function_00._M_str = "parse";
        logging_function_00._M_len = 5;
        BCLog::Logger::LogPrintStr(pLVar6,str_01,logging_function_00,source_file,0xe6,RPC,Debug);
        std::__cxx11::string::~string((string *)&log_msg);
      }
      psVar5 = local_d0;
LAB_002f94be:
      std::__cxx11::string::~string((string *)psVar5);
    }
  }
  else if (bVar2) {
    str_02._M_str = (this->strMethod)._M_dataplus._M_p;
    str_02._M_len = (this->strMethod)._M_string_length;
    SanitizeString_abi_cxx11_(&log_msg,str_02,0);
    logging_function._M_str = "parse";
    logging_function._M_len = 5;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/request.cpp";
    source_file_00._M_len = 0x58;
    LogPrintf_<std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file_00,0xe8,RPC,Debug,"ThreadRPCServer method=%s user=%s\n",
               &log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &this->authUser);
    psVar5 = &log_msg;
    goto LAB_002f94be;
  }
  key_02._M_str = "params";
  key_02._M_len = 6;
  pUVar3 = UniValue::find_value(pUVar3,key_02);
  if (pUVar3->typ - VOBJ < 2) {
    UniValue::operator=(&this->params,pUVar3);
  }
  else {
    if (pUVar3->typ != VNULL) {
      pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_msg,"Params must be an array or object",(allocator<char> *)&local_50
                );
      JSONRPCError(pUVar3,-0x7f58,&log_msg);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_002f9a6e;
    }
    local_138[0] = 0;
    str.field_2._M_allocated_capacity = (size_type)local_138;
    str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffea8._0_8_;
    str._M_string_length = in_stack_fffffffffffffea8._8_8_;
    str.field_2._8_8_ = 0;
    UniValue::UniValue((UniValue *)&log_msg,VARR,str);
    UniValue::operator=(&this->params,(UniValue *)&log_msg);
    UniValue::~UniValue((UniValue *)&log_msg);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_002f9a6e:
  __stack_chk_fail();
}

Assistant:

void JSONRPCRequest::parse(const UniValue& valRequest)
{
    // Parse request
    if (!valRequest.isObject())
        throw JSONRPCError(RPC_INVALID_REQUEST, "Invalid Request object");
    const UniValue& request = valRequest.get_obj();

    // Parse id now so errors from here on will have the id
    if (request.exists("id")) {
        id = request.find_value("id");
    } else {
        id = std::nullopt;
    }

    // Check for JSON-RPC 2.0 (default 1.1)
    m_json_version = JSONRPCVersion::V1_LEGACY;
    const UniValue& jsonrpc_version = request.find_value("jsonrpc");
    if (!jsonrpc_version.isNull()) {
        if (!jsonrpc_version.isStr()) {
            throw JSONRPCError(RPC_INVALID_REQUEST, "jsonrpc field must be a string");
        }
        // The "jsonrpc" key was added in the 2.0 spec, but some older documentation
        // incorrectly included {"jsonrpc":"1.0"} in a request object, so we
        // maintain that for backwards compatibility.
        if (jsonrpc_version.get_str() == "1.0") {
            m_json_version = JSONRPCVersion::V1_LEGACY;
        } else if (jsonrpc_version.get_str() == "2.0") {
            m_json_version = JSONRPCVersion::V2;
        } else {
            throw JSONRPCError(RPC_INVALID_REQUEST, "JSON-RPC version not supported");
        }
    }

    // Parse method
    const UniValue& valMethod{request.find_value("method")};
    if (valMethod.isNull())
        throw JSONRPCError(RPC_INVALID_REQUEST, "Missing method");
    if (!valMethod.isStr())
        throw JSONRPCError(RPC_INVALID_REQUEST, "Method must be a string");
    strMethod = valMethod.get_str();
    if (fLogIPs)
        LogDebug(BCLog::RPC, "ThreadRPCServer method=%s user=%s peeraddr=%s\n", SanitizeString(strMethod),
            this->authUser, this->peerAddr);
    else
        LogDebug(BCLog::RPC, "ThreadRPCServer method=%s user=%s\n", SanitizeString(strMethod), this->authUser);

    // Parse params
    const UniValue& valParams{request.find_value("params")};
    if (valParams.isArray() || valParams.isObject())
        params = valParams;
    else if (valParams.isNull())
        params = UniValue(UniValue::VARR);
    else
        throw JSONRPCError(RPC_INVALID_REQUEST, "Params must be an array or object");
}